

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_http_req_complete(Curl_easy *data,dynbuf *r,Curl_HttpReq httpreq)

{
  byte bVar1;
  uint uVar2;
  curl_mimepart *pcVar3;
  _Bool _Var4;
  CURLcode CVar5;
  curl_off_t size;
  char *pcVar6;
  ulong uVar7;
  curl_slist *pcVar8;
  Curl_creader *reader;
  Curl_creader *local_40;
  curl_off_t local_38;
  
  if ((((data->req).field_0xda & 0x80) != 0) &&
     (CVar5 = Curl_httpchunk_add_reader(data), CVar5 != CURLE_OK)) {
    return CVar5;
  }
  size = Curl_creader_total_length(data);
  if (httpreq - HTTPREQ_POST < 4) {
    if ((((-1 < size) && (uVar2 = *(uint *)&(data->req).field_0xd9, -1 < (short)uVar2)) &&
        (((uVar2 >> 0x12 & 1) != 0 ||
         (pcVar6 = Curl_checkheaders(data,"Content-Length",0xe), pcVar6 == (char *)0x0)))) &&
       (CVar5 = Curl_dyn_addf(r,"Content-Length: %ld\r\n",size), CVar5 != CURLE_OK)) {
      return CVar5;
    }
    pcVar3 = (data->state).mimepost;
    local_38 = size;
    if ((httpreq & (HTTPREQ_PUT|HTTPREQ_POST_FORM)) == HTTPREQ_POST_FORM &&
        pcVar3 != (curl_mimepart *)0x0) {
      pcVar8 = pcVar3->curlheaders;
      if (pcVar8 != (curl_slist *)0x0) {
        do {
          CVar5 = Curl_dyn_addf(r,"%s\r\n",pcVar8->data);
          if (CVar5 != CURLE_OK) {
            return CVar5;
          }
          pcVar8 = pcVar8->next;
        } while (pcVar8 != (curl_slist *)0x0);
        goto LAB_001341c5;
      }
    }
    else {
LAB_001341c5:
      if (((httpreq == HTTPREQ_POST) &&
          (pcVar6 = Curl_checkheaders(data,"Content-Type",0xc), pcVar6 == (char *)0x0)) &&
         (CVar5 = Curl_dyn_addn(r,"Content-Type: application/x-www-form-urlencoded\r\n",0x31),
         CVar5 != CURLE_OK)) {
        return CVar5;
      }
    }
    if ((data->req).upgr101 != UPGR101_INIT) {
      _Var4 = false;
      size = local_38;
      goto LAB_0013427f;
    }
    pcVar6 = Curl_checkheaders(data,"Expect",6);
    size = local_38;
    if (pcVar6 != (char *)0x0) {
      _Var4 = Curl_compareheader(pcVar6,"Expect:",7,"100-continue",0xc);
      goto LAB_0013427f;
    }
    if (((((data->state).field_0x774 & 0x80) == 0) && ((data->state).httpversion != '\n')) &&
       (bVar1 = data->conn->httpversion, bVar1 != 10)) {
      _Var4 = false;
      if ((0x13 < bVar1) || ((data->state).httpwant == '\x01')) goto LAB_0013427f;
      uVar7 = Curl_creader_client_length(data);
      if (0x100000 < uVar7) {
        CVar5 = Curl_dyn_addn(r,"Expect: 100-continue\r\n",0x16);
        if (CVar5 != CURLE_OK) {
          return CVar5;
        }
        _Var4 = true;
        goto LAB_0013427f;
      }
    }
  }
  _Var4 = false;
LAB_0013427f:
  CVar5 = Curl_dyn_addn(r,"\r\n",2);
  if (CVar5 == CURLE_OK) {
    Curl_pgrsSetUploadSize(data,size);
    if (_Var4 != false) {
      local_40 = (Curl_creader *)0x0;
      CVar5 = Curl_creader_create(&local_40,data,&cr_exp100,CURL_CR_PROTOCOL);
      if ((CVar5 != CURLE_OK) || (CVar5 = Curl_creader_add(data,local_40), CVar5 != CURLE_OK)) {
        if (local_40 == (Curl_creader *)0x0) {
          return CVar5;
        }
        Curl_creader_free(data,local_40);
        return CVar5;
      }
      *(undefined4 *)((long)local_40->ctx + 0x30) = 2;
    }
    Curl_xfer_setup1(data,3,-1,true);
    CVar5 = CURLE_OK;
  }
  return CVar5;
}

Assistant:

CURLcode Curl_http_req_complete(struct Curl_easy *data,
                                struct dynbuf *r, Curl_HttpReq httpreq)
{
  CURLcode result = CURLE_OK;
  curl_off_t req_clen;
  bool announced_exp100 = FALSE;

  DEBUGASSERT(data->conn);
#ifndef USE_HYPER
  if(data->req.upload_chunky) {
    result = Curl_httpchunk_add_reader(data);
    if(result)
      return result;
  }
#endif

  /* Get the request body length that has been set up */
  req_clen = Curl_creader_total_length(data);
  switch(httpreq) {
  case HTTPREQ_PUT:
  case HTTPREQ_POST:
#if !defined(CURL_DISABLE_MIME) || !defined(CURL_DISABLE_FORM_API)
  case HTTPREQ_POST_FORM:
  case HTTPREQ_POST_MIME:
#endif
    /* We only set Content-Length and allow a custom Content-Length if
       we do not upload data chunked, as RFC2616 forbids us to set both
       kinds of headers (Transfer-Encoding: chunked and Content-Length).
       We do not override a custom "Content-Length" header, but during
       authentication negotiation that header is suppressed.
     */
    if(req_clen >= 0 && !data->req.upload_chunky &&
       (data->req.authneg ||
        !Curl_checkheaders(data, STRCONST("Content-Length")))) {
      /* we allow replacing this header if not during auth negotiation,
         although it is not very wise to actually set your own */
      result = Curl_dyn_addf(r, "Content-Length: %" FMT_OFF_T "\r\n",
                             req_clen);
    }
    if(result)
      goto out;

#ifndef CURL_DISABLE_MIME
    /* Output mime-generated headers. */
    if(data->state.mimepost &&
       ((httpreq == HTTPREQ_POST_FORM) || (httpreq == HTTPREQ_POST_MIME))) {
      struct curl_slist *hdr;

      for(hdr = data->state.mimepost->curlheaders; hdr; hdr = hdr->next) {
        result = Curl_dyn_addf(r, "%s\r\n", hdr->data);
        if(result)
          goto out;
      }
    }
#endif
    if(httpreq == HTTPREQ_POST) {
      if(!Curl_checkheaders(data, STRCONST("Content-Type"))) {
        result = Curl_dyn_addn(r, STRCONST("Content-Type: application/"
                                           "x-www-form-urlencoded\r\n"));
        if(result)
          goto out;
      }
    }
    result = addexpect(data, r, &announced_exp100);
    if(result)
      goto out;
    break;
  default:
    break;
  }

  /* end of headers */
  result = Curl_dyn_addn(r, STRCONST("\r\n"));
  if(!result) {
    Curl_pgrsSetUploadSize(data, req_clen);
    if(announced_exp100)
      result = http_exp100_add_reader(data);
  }

out:
  if(!result) {
    /* setup variables for the upcoming transfer */
    Curl_xfer_setup1(data, CURL_XFER_SENDRECV, -1, TRUE);
  }
  return result;
}